

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sei.c
# Opt level: O2

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet,RK_S32 *len,RK_U32 recovery_frame_cnt)

{
  RK_S32 RVar1;
  uint len_00;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  MppWriteCtx bit_ctx;
  RK_U8 src [100];
  
  pvVar2 = mpp_packet_get_pos(packet);
  pvVar3 = mpp_packet_get_data(packet);
  sVar4 = mpp_packet_get_size(packet);
  sVar5 = mpp_packet_get_length(packet);
  src[0x50] = '\0';
  src[0x51] = '\0';
  src[0x52] = '\0';
  src[0x53] = '\0';
  src[0x54] = '\0';
  src[0x55] = '\0';
  src[0x56] = '\0';
  src[0x57] = '\0';
  src[0x58] = '\0';
  src[0x59] = '\0';
  src[0x5a] = '\0';
  src[0x5b] = '\0';
  src[0x5c] = '\0';
  src[0x5d] = '\0';
  src[0x5e] = '\0';
  src[0x5f] = '\0';
  src[0x40] = '\0';
  src[0x41] = '\0';
  src[0x42] = '\0';
  src[0x43] = '\0';
  src[0x44] = '\0';
  src[0x45] = '\0';
  src[0x46] = '\0';
  src[0x47] = '\0';
  src[0x48] = '\0';
  src[0x49] = '\0';
  src[0x4a] = '\0';
  src[0x4b] = '\0';
  src[0x4c] = '\0';
  src[0x4d] = '\0';
  src[0x4e] = '\0';
  src[0x4f] = '\0';
  src[0x30] = '\0';
  src[0x31] = '\0';
  src[0x32] = '\0';
  src[0x33] = '\0';
  src[0x34] = '\0';
  src[0x35] = '\0';
  src[0x36] = '\0';
  src[0x37] = '\0';
  src[0x38] = '\0';
  src[0x39] = '\0';
  src[0x3a] = '\0';
  src[0x3b] = '\0';
  src[0x3c] = '\0';
  src[0x3d] = '\0';
  src[0x3e] = '\0';
  src[0x3f] = '\0';
  src[0x20] = '\0';
  src[0x21] = '\0';
  src[0x22] = '\0';
  src[0x23] = '\0';
  src[0x24] = '\0';
  src[0x25] = '\0';
  src[0x26] = '\0';
  src[0x27] = '\0';
  src[0x28] = '\0';
  src[0x29] = '\0';
  src[0x2a] = '\0';
  src[0x2b] = '\0';
  src[0x2c] = '\0';
  src[0x2d] = '\0';
  src[0x2e] = '\0';
  src[0x2f] = '\0';
  src[0x10] = '\0';
  src[0x11] = '\0';
  src[0x12] = '\0';
  src[0x13] = '\0';
  src[0x14] = '\0';
  src[0x15] = '\0';
  src[0x16] = '\0';
  src[0x17] = '\0';
  src[0x18] = '\0';
  src[0x19] = '\0';
  src[0x1a] = '\0';
  src[0x1b] = '\0';
  src[0x1c] = '\0';
  src[0x1d] = '\0';
  src[0x1e] = '\0';
  src[0x1f] = '\0';
  src[0] = '\0';
  src[1] = '\0';
  src[2] = '\0';
  src[3] = '\0';
  src[4] = '\0';
  src[5] = '\0';
  src[6] = '\0';
  src[7] = '\0';
  src[8] = '\0';
  src[9] = '\0';
  src[10] = '\0';
  src[0xb] = '\0';
  src[0xc] = '\0';
  src[0xd] = '\0';
  src[0xe] = '\0';
  src[0xf] = '\0';
  src[0x60] = '\0';
  src[0x61] = '\0';
  src[0x62] = '\0';
  src[99] = '\0';
  mpp_writer_init(&bit_ctx,src,100);
  write_recovery_point(&bit_ctx,recovery_frame_cnt);
  RVar1 = mpp_writer_bytes(&bit_ctx);
  mpp_writer_init(&bit_ctx,(void *)((long)pvVar2 + sVar5),
                  ((int)sVar4 + (int)pvVar3) - (int)(void *)((long)pvVar2 + sVar5));
  mpp_writer_put_raw_bits(&bit_ctx,0,0x18);
  mpp_writer_put_raw_bits(&bit_ctx,1,8);
  mpp_writer_put_raw_bits(&bit_ctx,0,1);
  mpp_writer_put_raw_bits(&bit_ctx,0,2);
  mpp_writer_put_raw_bits(&bit_ctx,6,5);
  mpp_writer_put_bits(&bit_ctx,6,8);
  for (iVar6 = 0; iVar6 <= RVar1 + -0xff; iVar6 = iVar6 + 0xff) {
    mpp_writer_put_bits(&bit_ctx,0xff,8);
  }
  mpp_writer_put_bits(&bit_ctx,RVar1 - iVar6,8);
  write_recovery_point(&bit_ctx,recovery_frame_cnt);
  len_00 = mpp_writer_bytes(&bit_ctx);
  if (len != (RK_S32 *)0x0) {
    *len = len_00;
  }
  mpp_packet_set_length(packet,sVar5 + (long)(int)len_00);
  mpp_packet_add_segment_info(packet,6,(RK_S32)sVar5,len_00);
  if (((byte)h264e_debug & 0x80) != 0) {
    _mpp_log_l(4,"h264e_sei","sei data length %d pkt len %d -> %d\n",
               "h264e_sei_recovery_point_to_packet",(ulong)len_00,sVar5,sVar5 + (long)(int)len_00);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_sei_recovery_point_to_packet(MppPacket packet, RK_S32 *len, RK_U32 recovery_frame_cnt)
{
    MPP_RET ret = MPP_OK;
    void *pos = mpp_packet_get_pos(packet);
    void *pkt_base = mpp_packet_get_data(packet);
    size_t pkt_size = mpp_packet_get_size(packet);
    size_t length = mpp_packet_get_length(packet);
    void *dst = pos + length;
    RK_S32 buf_size = (pkt_base + pkt_size) - (pos + length);
    MppWriteCtx bit_ctx;
    MppWriteCtx *bit = &bit_ctx;
    RK_S32 payload_size = 0;
    RK_S32 type = H264_SEI_RECOVERY_POINT;
    RK_U8 src[100] = {0};
    RK_S32 sei_size = 0;
    RK_S32 i;
    mpp_writer_init(bit, src, 100);
    write_recovery_point(bit, recovery_frame_cnt);
    payload_size = mpp_writer_bytes(bit);

    mpp_writer_init(bit, dst, buf_size);

    /* start_code_prefix 00 00 00 01 */
    mpp_writer_put_raw_bits(bit, 0, 24);
    mpp_writer_put_raw_bits(bit, 1, 8);
    /* forbidden_zero_bit */
    mpp_writer_put_raw_bits(bit, 0, 1);
    /* nal_ref_idc */
    mpp_writer_put_raw_bits(bit, H264_NALU_PRIORITY_DISPOSABLE, 2);
    /* nal_unit_type */
    mpp_writer_put_raw_bits(bit, H264_NALU_TYPE_SEI, 5);

    /* sei_payload_type_ff_byte */
    for (i = 0; i <= type - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_type_byte */
    mpp_writer_put_bits(bit, type - i, 8);

    /* sei_payload_size_ff_byte */
    for (i = 0; i <= payload_size - 255; i += 255)
        mpp_writer_put_bits(bit, 0xff, 8);

    /* sei_last_payload_size_byte */
    mpp_writer_put_bits(bit, payload_size - i, 8);

    write_recovery_point(bit, recovery_frame_cnt);

    sei_size = mpp_writer_bytes(bit);
    if (len)
        *len = sei_size;

    mpp_packet_set_length(packet, length + sei_size);
    mpp_packet_add_segment_info(packet, H264_NALU_TYPE_SEI, length, sei_size);

    h264e_dbg_sei("sei data length %d pkt len %d -> %d\n", sei_size,
                  length, length + sei_size);

    return ret;

}